

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall
TPZAnalysis::ShowShape(TPZAnalysis *this,string *plotfile,TPZVec<long> *equationindices)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  vecnames;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  scalnames;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  local_2d8;
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  local_178;
  
  this->fStep = 1;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  TPZStack((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
            *)&local_178);
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  TPZStack((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
            *)&local_2d8);
  iVar1 = (**(code **)(*(long *)(this->fCompMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_left[1]._M_parent + 0x78))();
  if (iVar1 == 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Solution",&local_319);
    TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
    Push((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
          *)&local_178,&local_2f8);
    this_00 = &local_2f8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Solution",&local_319);
    TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
    Push((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
          *)&local_2d8,&local_318);
    this_00 = &local_318;
  }
  std::__cxx11::string::~string((string *)this_00);
  ShowShapeInternal<double>
            (this,(TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
                   *)&local_178,
             (TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
              *)&local_2d8,plotfile,equationindices);
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  ::~TPZManVector(&local_2d8);
  TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  ::~TPZManVector(&local_178);
  return;
}

Assistant:

void TPZAnalysis::ShowShape(const std::string &plotfile, TPZVec<int64_t> &equationindices)
{
	
    SetStep(1);
    TPZStack<std::string> scalnames,vecnames;
    TPZMaterial *mat = fCompMesh->MaterialVec().begin()->second;
    int nstate = mat->NStateVariables();
    if (nstate == 1) {
        scalnames.Push("Solution");
    }
    else
    {
        vecnames.Push("Solution");
    }
    //TODOCOMPLEX
    ShowShapeInternal<STATE>(scalnames,vecnames,plotfile,equationindices);
}